

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O0

void __thiscall jbcoin::STArray::STArray(STArray *this,STArray *other)

{
  SField *n;
  STArray *other_local;
  STArray *this_local;
  
  n = STBase::getFName(&other->super_STBase);
  STBase::STBase(&this->super_STBase,n);
  CountedObject<jbcoin::STArray>::CountedObject((CountedObject<jbcoin::STArray> *)this);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STArray_00519dc8;
  std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::vector(&this->v_,&other->v_);
  return;
}

Assistant:

STArray::STArray (STArray&& other)
    : STBase(other.getFName())
    , v_(std::move(other.v_))
{
}